

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnLoadExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_b8;
  Address offset_local;
  int local_a8;
  Opcode opcode_local;
  _Head_base<0UL,_wabt::Expr_*,_false> local_a0;
  Location local_98;
  Var local_78;
  
  offset_local = offset;
  opcode_local = opcode;
  GetLocation(&local_98,this);
  Var::Var(&local_78,memidx,&local_98);
  local_a8 = 1 << ((byte)alignment_log2 & 0x1f);
  std::
  make_unique<wabt::LoadStoreExpr<(wabt::ExprType)23>,wabt::Opcode&,wabt::Var,int,unsigned_long&>
            ((Opcode *)&local_b8,(Var *)&opcode_local,(int *)&local_78,(unsigned_long *)&local_a8);
  local_a0._M_head_impl = local_b8;
  local_b8 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a0);
  if (local_a0._M_head_impl != (Expr *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_b8 != (Expr *)0x0) {
    (**(code **)(*(long *)local_b8 + 8))();
  }
  local_b8 = (Expr *)0x0;
  Var::~Var(&local_78);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnLoadExpr(Opcode opcode,
                                  Index memidx,
                                  Address alignment_log2,
                                  Address offset) {
  return AppendExpr(std::make_unique<LoadExpr>(
      opcode, Var(memidx, GetLocation()), 1 << alignment_log2, offset));
}